

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  Ref<embree::Geometry> *pRVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  vbool<4> vVar15;
  bool bVar16;
  uint uVar17;
  undefined4 uVar18;
  int iVar19;
  AABBNodeMB4D *node1;
  ulong uVar20;
  RTCIntersectArguments *pRVar21;
  uint uVar22;
  size_t sVar23;
  long lVar24;
  size_t sVar25;
  vfloat<4> *pvVar26;
  vfloat<4> *pvVar27;
  NodeRef *pNVar28;
  NodeRef root;
  long lVar29;
  float fVar30;
  float fVar41;
  float fVar42;
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar57;
  float fVar59;
  vint4 ai_1;
  undefined1 auVar55 [16];
  float fVar54;
  float fVar58;
  float fVar60;
  float fVar61;
  undefined1 auVar56 [16];
  float fVar62;
  float fVar67;
  float fVar68;
  vint4 ai_3;
  undefined1 auVar63 [16];
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  float fVar73;
  float fVar75;
  vint4 bi;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  vint4 bi_3;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar98;
  float fVar101;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar96 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar97;
  uint uVar107;
  float fVar108;
  float fVar109;
  uint uVar110;
  float fVar111;
  uint uVar112;
  float fVar113;
  vint4 ai_2;
  uint uVar114;
  float fVar115;
  uint uVar116;
  uint uVar117;
  float fVar118;
  uint uVar119;
  uint uVar120;
  float fVar121;
  uint uVar122;
  uint uVar123;
  float fVar124;
  vint4 bi_2;
  uint uVar125;
  uint uVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  undefined1 local_1a48 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1a38;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float fStack_1a1c;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  Precalculations pre;
  undefined1 local_19f8 [16];
  undefined1 local_19d8 [16];
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  vbool<4> terminated;
  undefined1 local_1968 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_18f8 [16];
  BVH *local_18e8;
  Intersectors *local_18e0;
  TravRayK<4,_false> tray;
  undefined1 local_17c8 [20];
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  float local_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1778;
  uint local_1768;
  uint uStack_1764;
  uint uStack_1760;
  uint uStack_175c;
  uint local_1758;
  uint uStack_1754;
  uint uStack_1750;
  uint uStack_174c;
  uint local_1748;
  uint uStack_1744;
  uint uStack_1740;
  uint uStack_173c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar14 = mm_lookupmask_ps._8_8_;
  uVar13 = mm_lookupmask_ps._0_8_;
  local_18e8 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_18e8->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar49._8_4_ = 0xffffffff;
    auVar49._0_8_ = 0xffffffffffffffff;
    auVar49._12_4_ = 0xffffffff;
    auVar55 = *(undefined1 (*) [16])(ray + 0x80);
    auVar63._0_12_ = ZEXT812(0);
    auVar63._12_4_ = 0;
    uVar116 = -(uint)(0.0 <= auVar55._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar119 = -(uint)(0.0 <= auVar55._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar122 = -(uint)(0.0 <= auVar55._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar125 = -(uint)(0.0 <= auVar55._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar32._4_4_ = uVar119;
    auVar32._0_4_ = uVar116;
    auVar32._8_4_ = uVar122;
    auVar32._12_4_ = uVar125;
    uVar22 = movmskps((int)context,auVar32);
    sVar23 = (size_t)uVar22;
    if (uVar22 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar79 = (float)DAT_01f4bd50;
      fVar82 = DAT_01f4bd50._4_4_;
      fVar85 = DAT_01f4bd50._8_4_;
      fVar88 = DAT_01f4bd50._12_4_;
      auVar44._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar82);
      auVar44._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar79);
      auVar44._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar85);
      auVar44._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar88);
      auVar94 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar44)
      ;
      auVar71._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar82);
      auVar71._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar79);
      auVar71._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar85);
      auVar71._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar88);
      auVar44 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar71)
      ;
      auVar31._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar82);
      auVar31._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar79);
      auVar31._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar85);
      auVar31._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar88);
      auVar71 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar31)
      ;
      auVar32 = rcpps(auVar31,auVar94);
      fVar79 = auVar32._0_4_;
      auVar95._0_4_ = auVar94._0_4_ * fVar79;
      fVar82 = auVar32._4_4_;
      auVar95._4_4_ = auVar94._4_4_ * fVar82;
      fVar85 = auVar32._8_4_;
      auVar95._8_4_ = auVar94._8_4_ * fVar85;
      fVar88 = auVar32._12_4_;
      auVar95._12_4_ = auVar94._12_4_ * fVar88;
      tray.rdir.field_0._0_4_ = (1.0 - auVar95._0_4_) * fVar79 + fVar79;
      tray.rdir.field_0._4_4_ = (1.0 - auVar95._4_4_) * fVar82 + fVar82;
      tray.rdir.field_0._8_4_ = (1.0 - auVar95._8_4_) * fVar85 + fVar85;
      tray.rdir.field_0._12_4_ = (1.0 - auVar95._12_4_) * fVar88 + fVar88;
      auVar32 = rcpps(auVar95,auVar44);
      fVar79 = auVar32._0_4_;
      fVar82 = auVar32._4_4_;
      fVar85 = auVar32._8_4_;
      fVar88 = auVar32._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar44._0_4_ * fVar79) * fVar79 + fVar79;
      tray.rdir.field_0._20_4_ = (1.0 - auVar44._4_4_ * fVar82) * fVar82 + fVar82;
      tray.rdir.field_0._24_4_ = (1.0 - auVar44._8_4_ * fVar85) * fVar85 + fVar85;
      tray.rdir.field_0._28_4_ = (1.0 - auVar44._12_4_ * fVar88) * fVar88 + fVar88;
      auVar32 = rcpps(auVar32,auVar71);
      fVar79 = auVar32._0_4_;
      fVar82 = auVar32._4_4_;
      fVar85 = auVar32._8_4_;
      fVar88 = auVar32._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar71._0_4_ * fVar79) * fVar79 + fVar79;
      tray.rdir.field_0._36_4_ = (1.0 - auVar71._4_4_ * fVar82) * fVar82 + fVar82;
      tray.rdir.field_0._40_4_ = (1.0 - auVar71._8_4_ * fVar85) * fVar85 + fVar85;
      tray.rdir.field_0._44_4_ = (1.0 - auVar71._12_4_ * fVar88) * fVar88 + fVar88;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar94._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar94._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar94._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar94._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar94);
      auVar33._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar33._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar33._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar33._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar33);
      auVar32 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar63);
      fVar79 = (float)DAT_01f45a30;
      fVar82 = DAT_01f45a30._4_4_;
      fVar85 = DAT_01f45a30._8_4_;
      fVar88 = DAT_01f45a30._12_4_;
      auVar34._4_4_ = uVar119;
      auVar34._0_4_ = uVar116;
      auVar34._8_4_ = uVar122;
      auVar34._12_4_ = uVar125;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar32,auVar34);
      auVar55 = maxps(auVar55,auVar63);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar55,auVar34);
      auVar55._4_4_ = uVar119;
      auVar55._0_4_ = uVar116;
      auVar55._8_4_ = uVar122;
      auVar55._12_4_ = uVar125;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar49 ^ auVar55);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar22 = 3;
      }
      else {
        sVar23 = CONCAT71((int7)((ulong)context->args >> 8),
                          *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01;
        uVar22 = ((char)sVar23 == '\0') + 2;
      }
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar17 = 0x2223f80;
      pvVar26 = stack_near + 2;
      local_18e0 = This;
LAB_006c19e3:
      do {
        do {
          root.ptr = pNVar28[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006c2889;
          pNVar28 = pNVar28 + -1;
          pvVar27 = pvVar26 + -1;
          fVar93 = (pvVar27->field_0).v[0];
          fVar100 = pvVar26[-1].field_0.v[1];
          fVar103 = pvVar26[-1].field_0.v[2];
          fVar106 = pvVar26[-1].field_0.v[3];
          auVar35._4_4_ = -(uint)(fVar100 < tray.tfar.field_0.v[1]);
          auVar35._0_4_ = -(uint)(fVar93 < tray.tfar.field_0.v[0]);
          auVar35._8_4_ = -(uint)(fVar103 < tray.tfar.field_0.v[2]);
          auVar35._12_4_ = -(uint)(fVar106 < tray.tfar.field_0.v[3]);
          uVar17 = movmskps(uVar17,auVar35);
          pvVar26 = pvVar27;
        } while (uVar17 == 0);
        uVar20 = (ulong)(byte)uVar17;
        auVar135._0_4_ = uVar17 & 0xff;
        if (uVar22 < (uint)POPCOUNT(auVar135._0_4_)) {
LAB_006c1a25:
          vVar15.field_0 = terminated.field_0;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006c2889;
              auVar38._4_4_ = -(uint)(fVar100 < tray.tfar.field_0.v[1]);
              auVar38._0_4_ = -(uint)(fVar93 < tray.tfar.field_0.v[0]);
              auVar38._8_4_ = -(uint)(fVar103 < tray.tfar.field_0.v[2]);
              auVar38._12_4_ = -(uint)(fVar106 < tray.tfar.field_0.v[3]);
              uVar17 = movmskps(uVar17,auVar38);
              pvVar26 = pvVar27;
              if (uVar17 == 0) goto LAB_006c19e3;
              sVar23 = (ulong)((uint)root.ptr & 0xf) - 8;
              local_1968._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_1968._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              local_1968._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar24 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              sVar25 = 0;
              goto LAB_006c1d10;
            }
            uVar20 = root.ptr & 0xfffffffffffffff0;
            uVar17 = (uint)root.ptr & 7;
            sVar23 = (size_t)uVar17;
            bVar16 = fVar93 < tray.tfar.field_0.v[0];
            bVar8 = fVar100 < tray.tfar.field_0.v[1];
            bVar9 = fVar103 < tray.tfar.field_0.v[2];
            bVar10 = fVar106 < tray.tfar.field_0.v[3];
            root.ptr = 8;
            fVar93 = fVar79;
            fVar100 = fVar82;
            fVar103 = fVar85;
            fVar106 = fVar88;
            for (lVar24 = -0x10;
                (lVar24 != 0 && (sVar25 = *(size_t *)(uVar20 + 0x20 + lVar24 * 2), sVar25 != 8));
                lVar24 = lVar24 + 4) {
              fVar43 = *(float *)(uVar20 + 0x90 + lVar24);
              fVar53 = *(float *)(uVar20 + 0x30 + lVar24);
              fVar77 = *(float *)(uVar20 + 0x40 + lVar24);
              fVar61 = *(float *)(uVar20 + 0x50 + lVar24);
              fVar80 = *(float *)(uVar20 + 0x60 + lVar24);
              fVar58 = *(float *)(ray + 0x70);
              fVar60 = *(float *)(ray + 0x74);
              fVar109 = *(float *)(ray + 0x78);
              fVar48 = *(float *)(ray + 0x7c);
              fVar62 = *(float *)(uVar20 + 0xb0 + lVar24);
              fVar69 = *(float *)(uVar20 + 0xd0 + lVar24);
              fVar70 = *(float *)(uVar20 + 0x70 + lVar24);
              fVar83 = *(float *)(uVar20 + 0xa0 + lVar24);
              fVar86 = *(float *)(uVar20 + 0xc0 + lVar24);
              fVar89 = *(float *)(uVar20 + 0xe0 + lVar24);
              fVar54 = *(float *)(uVar20 + 0x80 + lVar24);
              fVar30 = ((fVar43 * fVar58 + fVar53) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar41 = ((fVar43 * fVar60 + fVar53) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar42 = ((fVar43 * fVar109 + fVar53) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar43 = ((fVar43 * fVar48 + fVar53) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar53 = ((fVar62 * fVar58 + fVar61) - (float)tray.org.field_0._16_4_) *
                       (float)tray.rdir.field_0._16_4_;
              fVar57 = ((fVar62 * fVar60 + fVar61) - (float)tray.org.field_0._20_4_) *
                       (float)tray.rdir.field_0._20_4_;
              fVar59 = ((fVar62 * fVar109 + fVar61) - (float)tray.org.field_0._24_4_) *
                       (float)tray.rdir.field_0._24_4_;
              fVar61 = ((fVar62 * fVar48 + fVar61) - (float)tray.org.field_0._28_4_) *
                       (float)tray.rdir.field_0._28_4_;
              fVar62 = ((fVar69 * fVar58 + fVar70) - (float)tray.org.field_0._32_4_) *
                       (float)tray.rdir.field_0._32_4_;
              fVar67 = ((fVar69 * fVar60 + fVar70) - (float)tray.org.field_0._36_4_) *
                       (float)tray.rdir.field_0._36_4_;
              fVar68 = ((fVar69 * fVar109 + fVar70) - (float)tray.org.field_0._40_4_) *
                       (float)tray.rdir.field_0._40_4_;
              fVar69 = ((fVar69 * fVar48 + fVar70) - (float)tray.org.field_0._44_4_) *
                       (float)tray.rdir.field_0._44_4_;
              fVar70 = ((fVar83 * fVar58 + fVar77) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar73 = ((fVar83 * fVar60 + fVar77) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar75 = ((fVar83 * fVar109 + fVar77) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar77 = ((fVar83 * fVar48 + fVar77) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar91 = ((fVar86 * fVar58 + fVar80) - (float)tray.org.field_0._16_4_) *
                       (float)tray.rdir.field_0._16_4_;
              fVar98 = ((fVar86 * fVar60 + fVar80) - (float)tray.org.field_0._20_4_) *
                       (float)tray.rdir.field_0._20_4_;
              fVar101 = ((fVar86 * fVar109 + fVar80) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar104 = ((fVar86 * fVar48 + fVar80) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar80 = ((fVar89 * fVar58 + fVar54) - (float)tray.org.field_0._32_4_) *
                       (float)tray.rdir.field_0._32_4_;
              fVar83 = ((fVar89 * fVar60 + fVar54) - (float)tray.org.field_0._36_4_) *
                       (float)tray.rdir.field_0._36_4_;
              fVar86 = ((fVar89 * fVar109 + fVar54) - (float)tray.org.field_0._40_4_) *
                       (float)tray.rdir.field_0._40_4_;
              fVar89 = ((fVar89 * fVar48 + fVar54) - (float)tray.org.field_0._44_4_) *
                       (float)tray.rdir.field_0._44_4_;
              auVar135._0_4_ =
                   (uint)((int)fVar70 < (int)fVar30) * (int)fVar70 |
                   (uint)((int)fVar70 >= (int)fVar30) * (int)fVar30;
              auVar135._4_4_ =
                   (uint)((int)fVar73 < (int)fVar41) * (int)fVar73 |
                   (uint)((int)fVar73 >= (int)fVar41) * (int)fVar41;
              auVar135._8_4_ =
                   (uint)((int)fVar75 < (int)fVar42) * (int)fVar75 |
                   (uint)((int)fVar75 >= (int)fVar42) * (int)fVar42;
              auVar135._12_4_ =
                   (uint)((int)fVar77 < (int)fVar43) * (int)fVar77 |
                   (uint)((int)fVar77 >= (int)fVar43) * (int)fVar43;
              uVar117 = (uint)((int)fVar91 < (int)fVar53) * (int)fVar91 |
                        (uint)((int)fVar91 >= (int)fVar53) * (int)fVar53;
              uVar120 = (uint)((int)fVar98 < (int)fVar57) * (int)fVar98 |
                        (uint)((int)fVar98 >= (int)fVar57) * (int)fVar57;
              uVar123 = (uint)((int)fVar101 < (int)fVar59) * (int)fVar101 |
                        (uint)((int)fVar101 >= (int)fVar59) * (int)fVar59;
              uVar126 = (uint)((int)fVar104 < (int)fVar61) * (int)fVar104 |
                        (uint)((int)fVar104 >= (int)fVar61) * (int)fVar61;
              uVar117 = ((int)uVar117 < (int)auVar135._0_4_) * auVar135._0_4_ |
                        ((int)uVar117 >= (int)auVar135._0_4_) * uVar117;
              uVar120 = ((int)uVar120 < (int)auVar135._4_4_) * auVar135._4_4_ |
                        ((int)uVar120 >= (int)auVar135._4_4_) * uVar120;
              uVar123 = ((int)uVar123 < (int)auVar135._8_4_) * auVar135._8_4_ |
                        ((int)uVar123 >= (int)auVar135._8_4_) * uVar123;
              uVar126 = ((int)uVar126 < (int)auVar135._12_4_) * auVar135._12_4_ |
                        ((int)uVar126 >= (int)auVar135._12_4_) * uVar126;
              auVar135._0_4_ =
                   (uint)((int)fVar80 < (int)fVar62) * (int)fVar80 |
                   (uint)((int)fVar80 >= (int)fVar62) * (int)fVar62;
              auVar135._4_4_ =
                   (uint)((int)fVar83 < (int)fVar67) * (int)fVar83 |
                   (uint)((int)fVar83 >= (int)fVar67) * (int)fVar67;
              auVar135._8_4_ =
                   (uint)((int)fVar86 < (int)fVar68) * (int)fVar86 |
                   (uint)((int)fVar86 >= (int)fVar68) * (int)fVar68;
              auVar135._12_4_ =
                   (uint)((int)fVar89 < (int)fVar69) * (int)fVar89 |
                   (uint)((int)fVar89 >= (int)fVar69) * (int)fVar69;
              uVar107 = ((int)auVar135._0_4_ < (int)uVar117) * uVar117 |
                        ((int)auVar135._0_4_ >= (int)uVar117) * auVar135._0_4_;
              uVar110 = ((int)auVar135._4_4_ < (int)uVar120) * uVar120 |
                        ((int)auVar135._4_4_ >= (int)uVar120) * auVar135._4_4_;
              uVar112 = ((int)auVar135._8_4_ < (int)uVar123) * uVar123 |
                        ((int)auVar135._8_4_ >= (int)uVar123) * auVar135._8_4_;
              uVar114 = ((int)auVar135._12_4_ < (int)uVar126) * uVar126 |
                        ((int)auVar135._12_4_ >= (int)uVar126) * auVar135._12_4_;
              auVar135._0_4_ =
                   (uint)((int)fVar70 < (int)fVar30) * (int)fVar30 |
                   (uint)((int)fVar70 >= (int)fVar30) * (int)fVar70;
              auVar135._4_4_ =
                   (uint)((int)fVar73 < (int)fVar41) * (int)fVar41 |
                   (uint)((int)fVar73 >= (int)fVar41) * (int)fVar73;
              auVar135._8_4_ =
                   (uint)((int)fVar75 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar75 >= (int)fVar42) * (int)fVar75;
              auVar135._12_4_ =
                   (uint)((int)fVar77 < (int)fVar43) * (int)fVar43 |
                   (uint)((int)fVar77 >= (int)fVar43) * (int)fVar77;
              uVar117 = (uint)((int)fVar91 < (int)fVar53) * (int)fVar53 |
                        (uint)((int)fVar91 >= (int)fVar53) * (int)fVar91;
              uVar120 = (uint)((int)fVar98 < (int)fVar57) * (int)fVar57 |
                        (uint)((int)fVar98 >= (int)fVar57) * (int)fVar98;
              uVar123 = (uint)((int)fVar101 < (int)fVar59) * (int)fVar59 |
                        (uint)((int)fVar101 >= (int)fVar59) * (int)fVar101;
              uVar126 = (uint)((int)fVar104 < (int)fVar61) * (int)fVar61 |
                        (uint)((int)fVar104 >= (int)fVar61) * (int)fVar104;
              uVar117 = ((int)auVar135._0_4_ < (int)uVar117) * auVar135._0_4_ |
                        ((int)auVar135._0_4_ >= (int)uVar117) * uVar117;
              uVar120 = ((int)auVar135._4_4_ < (int)uVar120) * auVar135._4_4_ |
                        ((int)auVar135._4_4_ >= (int)uVar120) * uVar120;
              uVar123 = ((int)auVar135._8_4_ < (int)uVar123) * auVar135._8_4_ |
                        ((int)auVar135._8_4_ >= (int)uVar123) * uVar123;
              uVar126 = ((int)auVar135._12_4_ < (int)uVar126) * auVar135._12_4_ |
                        ((int)auVar135._12_4_ >= (int)uVar126) * uVar126;
              auVar135._0_4_ =
                   (uint)((int)fVar80 < (int)fVar62) * (int)fVar62 |
                   (uint)((int)fVar80 >= (int)fVar62) * (int)fVar80;
              auVar135._4_4_ =
                   (uint)((int)fVar83 < (int)fVar67) * (int)fVar67 |
                   (uint)((int)fVar83 >= (int)fVar67) * (int)fVar83;
              auVar135._8_4_ =
                   (uint)((int)fVar86 < (int)fVar68) * (int)fVar68 |
                   (uint)((int)fVar86 >= (int)fVar68) * (int)fVar86;
              auVar135._12_4_ =
                   (uint)((int)fVar89 < (int)fVar69) * (int)fVar69 |
                   (uint)((int)fVar89 >= (int)fVar69) * (int)fVar89;
              auVar135._0_4_ =
                   ((int)uVar117 < (int)auVar135._0_4_) * uVar117 |
                   ((int)uVar117 >= (int)auVar135._0_4_) * auVar135._0_4_;
              auVar135._4_4_ =
                   ((int)uVar120 < (int)auVar135._4_4_) * uVar120 |
                   ((int)uVar120 >= (int)auVar135._4_4_) * auVar135._4_4_;
              auVar135._8_4_ =
                   ((int)uVar123 < (int)auVar135._8_4_) * uVar123 |
                   ((int)uVar123 >= (int)auVar135._8_4_) * auVar135._8_4_;
              auVar135._12_4_ =
                   ((int)uVar126 < (int)auVar135._12_4_) * uVar126 |
                   ((int)uVar126 >= (int)auVar135._12_4_) * auVar135._12_4_;
              bVar4 = (float)((tray.tnear.field_0.i[0] < (int)uVar107) * uVar107 |
                             (uint)(tray.tnear.field_0.i[0] >= (int)uVar107) *
                             tray.tnear.field_0.i[0]) <=
                      (float)((uint)(tray.tfar.field_0.i[0] < (int)auVar135._0_4_) *
                              tray.tfar.field_0.i[0] |
                             (tray.tfar.field_0.i[0] >= (int)auVar135._0_4_) * auVar135._0_4_);
              bVar5 = (float)((tray.tnear.field_0.i[1] < (int)uVar110) * uVar110 |
                             (uint)(tray.tnear.field_0.i[1] >= (int)uVar110) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)auVar135._4_4_) *
                              tray.tfar.field_0.i[1] |
                             (tray.tfar.field_0.i[1] >= (int)auVar135._4_4_) * auVar135._4_4_);
              bVar6 = (float)((tray.tnear.field_0.i[2] < (int)uVar112) * uVar112 |
                             (uint)(tray.tnear.field_0.i[2] >= (int)uVar112) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)auVar135._8_4_) *
                              tray.tfar.field_0.i[2] |
                             (tray.tfar.field_0.i[2] >= (int)auVar135._8_4_) * auVar135._8_4_);
              bVar7 = (float)((tray.tnear.field_0.i[3] < (int)uVar114) * uVar114 |
                             (uint)(tray.tnear.field_0.i[3] >= (int)uVar114) *
                             tray.tnear.field_0.i[3]) <=
                      (float)((uint)(tray.tfar.field_0.i[3] < (int)auVar135._12_4_) *
                              tray.tfar.field_0.i[3] |
                             (tray.tfar.field_0.i[3] >= (int)auVar135._12_4_) * auVar135._12_4_);
              if (uVar17 == 6) {
                fVar43 = *(float *)(uVar20 + 0xf0 + lVar24);
                fVar53 = *(float *)(uVar20 + 0x100 + lVar24);
                bVar4 = (fVar58 < fVar53 && fVar43 <= fVar58) && bVar4;
                bVar5 = (fVar60 < fVar53 && fVar43 <= fVar60) && bVar5;
                bVar6 = (fVar109 < fVar53 && fVar43 <= fVar109) && bVar6;
                bVar7 = (fVar48 < fVar53 && fVar43 <= fVar48) && bVar7;
              }
              auVar36._0_4_ = (-(uint)bVar4 & -(uint)bVar16) << 0x1f;
              auVar36._4_4_ = (-(uint)bVar5 & -(uint)bVar8) << 0x1f;
              auVar36._8_4_ = (-(uint)bVar6 & -(uint)bVar9) << 0x1f;
              auVar36._12_4_ = (-(uint)bVar7 & -(uint)bVar10) << 0x1f;
              auVar135._0_4_ = movmskps((int)valid_i,auVar36);
              valid_i = (vint<4> *)(ulong)auVar135._0_4_;
              if (auVar135._0_4_ == 0) {
                auVar51._4_4_ = fVar100;
                auVar51._0_4_ = fVar93;
                auVar51._8_4_ = fVar103;
                auVar51._12_4_ = fVar106;
                sVar25 = root.ptr;
              }
              else {
                auVar50._4_4_ = fVar82;
                auVar50._0_4_ = fVar79;
                auVar50._8_4_ = fVar85;
                auVar50._12_4_ = fVar88;
                auVar11._4_4_ = uVar110;
                auVar11._0_4_ = uVar107;
                auVar11._8_4_ = uVar112;
                auVar11._12_4_ = uVar114;
                auVar51 = blendvps(auVar50,auVar11,auVar36);
                if (root.ptr != 8) {
                  pNVar28->ptr = root.ptr;
                  pNVar28 = pNVar28 + 1;
                  (pvVar27->field_0).v[0] = fVar93;
                  (pvVar27->field_0).v[1] = fVar100;
                  (pvVar27->field_0).v[2] = fVar103;
                  (pvVar27->field_0).v[3] = fVar106;
                  pvVar27 = pvVar27 + 1;
                }
              }
              fVar93 = auVar51._0_4_;
              fVar100 = auVar51._4_4_;
              fVar103 = auVar51._8_4_;
              fVar106 = auVar51._12_4_;
              root.ptr = sVar25;
            }
            if (root.ptr == 8) goto LAB_006c1c9b;
            auVar37._4_4_ = -(uint)(fVar100 < tray.tfar.field_0.v[1]);
            auVar37._0_4_ = -(uint)(fVar93 < tray.tfar.field_0.v[0]);
            auVar37._8_4_ = -(uint)(fVar103 < tray.tfar.field_0.v[2]);
            auVar37._12_4_ = -(uint)(fVar106 < tray.tfar.field_0.v[3]);
            uVar18 = movmskps((int)uVar20,auVar37);
            uVar17 = POPCOUNT(uVar18);
          } while ((byte)uVar22 < (byte)uVar17);
          pNVar28->ptr = root.ptr;
          pNVar28 = pNVar28 + 1;
          (pvVar27->field_0).v[0] = fVar93;
          (pvVar27->field_0).v[1] = fVar100;
          (pvVar27->field_0).v[2] = fVar103;
          (pvVar27->field_0).v[3] = fVar106;
          pvVar27 = pvVar27 + 1;
LAB_006c1c9b:
          uVar17 = 4;
        }
        else {
          while (uVar20 != 0) {
            sVar25 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> sVar25 & 1) == 0; sVar25 = sVar25 + 1) {
              }
            }
            uVar20 = uVar20 & uVar20 - 1;
            sVar23 = sVar25;
            valid_i = (vint<4> *)local_18e0;
            bVar16 = occluded1(local_18e0,local_18e8,root,sVar25,&pre,ray,&tray,context);
            if (bVar16) {
              *(undefined4 *)(local_1968 + sVar25 * 4 + -0x10) = 0xffffffff;
            }
          }
          auVar135._4_4_ = movmskps((int)sVar23,(undefined1  [16])terminated.field_0);
          sVar23 = (size_t)auVar135._4_4_;
          uVar17 = 3;
          fVar79 = INFINITY;
          fVar82 = INFINITY;
          fVar85 = INFINITY;
          fVar88 = INFINITY;
          if (auVar135._4_4_ != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar17 = 2;
          }
          if (uVar22 < (uint)POPCOUNT(auVar135._0_4_)) goto LAB_006c1a25;
        }
        pvVar26 = pvVar27;
      } while ((uVar17 == 4) || (uVar17 == 2));
LAB_006c2889:
      auVar40._0_4_ = uVar116 & terminated.field_0.i[0];
      auVar40._4_4_ = uVar119 & terminated.field_0.i[1];
      auVar40._8_4_ = uVar122 & terminated.field_0.i[2];
      auVar40._12_4_ = uVar125 & terminated.field_0.i[3];
      auVar55 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar40);
      *(undefined1 (*) [16])(ray + 0x80) = auVar55;
    }
  }
  return;
LAB_006c1d10:
  do {
    lVar29 = -0x10;
    if (sVar25 == sVar23) {
      auVar52 = local_1a48;
      auVar66 = local_19f8;
      auVar72 = local_19d8;
      aVar97 = local_1a38;
      fVar93 = local_1a28;
      fVar100 = fStack_1a24;
      fVar103 = fStack_1a20;
      fVar106 = fStack_1a1c;
      fVar43 = local_1a18;
      fVar53 = fStack_1a14;
      fVar77 = fStack_1a10;
      fVar61 = fStack_1a0c;
      fVar80 = local_1a58;
      fVar62 = fStack_1a54;
      fVar69 = fStack_1a50;
      fVar70 = fStack_1a4c;
      break;
    }
    auVar135._0_4_ = local_1968._0_4_;
    auVar135._4_4_ = local_1968._4_4_;
    auVar135._8_4_ = local_1968._8_4_;
    auVar135._12_4_ = local_1968._12_4_;
    do {
      auVar52 = local_1a48;
      auVar66 = local_19f8;
      auVar72 = local_19d8;
      aVar97 = local_1a38;
      fVar93 = local_1a28;
      fVar100 = fStack_1a24;
      fVar103 = fStack_1a20;
      fVar106 = fStack_1a1c;
      fVar43 = local_1a18;
      fVar53 = fStack_1a14;
      fVar77 = fStack_1a10;
      fVar61 = fStack_1a0c;
      fVar80 = local_1a58;
      fVar62 = fStack_1a54;
      fVar69 = fStack_1a50;
      fVar70 = fStack_1a4c;
      if (lVar29 == 0) break;
      uVar117 = *(uint *)(lVar24 + lVar29);
      uVar17 = 0xffffffff;
      if ((ulong)uVar117 == 0xffffffff) break;
      fVar54 = *(float *)(ray + 0x50);
      fVar58 = *(float *)(ray + 0x54);
      fVar60 = *(float *)(ray + 0x58);
      fVar109 = *(float *)(ray + 0x5c);
      fVar48 = *(float *)(ray + 0x70);
      fVar30 = *(float *)(ray + 0x74);
      fVar41 = *(float *)(ray + 0x78);
      fVar42 = *(float *)(ray + 0x7c);
      fVar93 = *(float *)(lVar24 + -0x90 + lVar29);
      fVar100 = *(float *)(lVar24 + -0x80 + lVar29);
      fVar103 = *(float *)(lVar24 + -0x70 + lVar29);
      fVar70 = *(float *)(lVar24 + -0x120 + lVar29);
      fVar83 = *(float *)(lVar24 + -0x110 + lVar29);
      fVar86 = *(float *)(lVar24 + -0x100 + lVar29);
      fVar106 = *(float *)(lVar24 + -0xf0 + lVar29);
      fVar57 = fVar93 * fVar48 + fVar70;
      fVar59 = fVar93 * fVar30 + fVar70;
      fVar67 = fVar93 * fVar41 + fVar70;
      fVar70 = fVar93 * fVar42 + fVar70;
      fVar68 = fVar100 * fVar48 + fVar83;
      fVar73 = fVar100 * fVar30 + fVar83;
      fVar75 = fVar100 * fVar41 + fVar83;
      fVar83 = fVar100 * fVar42 + fVar83;
      fVar91 = fVar103 * fVar48 + fVar86;
      fVar98 = fVar103 * fVar30 + fVar86;
      fVar101 = fVar103 * fVar41 + fVar86;
      fVar86 = fVar103 * fVar42 + fVar86;
      fVar93 = *(float *)(lVar24 + -0x60 + lVar29);
      fVar100 = *(float *)(lVar24 + -0x50 + lVar29);
      fVar103 = *(float *)(lVar24 + -0x40 + lVar29);
      fVar43 = *(float *)(lVar24 + -0xe0 + lVar29);
      fVar53 = *(float *)(lVar24 + -0xd0 + lVar29);
      fVar77 = *(float *)(lVar24 + -0x30 + lVar29);
      fVar61 = *(float *)(lVar24 + -0x20 + lVar29);
      fVar80 = *(float *)(lVar24 + -0x10 + lVar29);
      fVar62 = *(float *)(lVar24 + -0xc0 + lVar29);
      fVar69 = *(float *)(lVar24 + -0xb0 + lVar29);
      fVar89 = *(float *)(lVar24 + -0xa0 + lVar29);
      fVar104 = fVar57 - (fVar93 * fVar48 + fVar106);
      fVar74 = fVar59 - (fVar93 * fVar30 + fVar106);
      fVar76 = fVar67 - (fVar93 * fVar41 + fVar106);
      fVar78 = fVar70 - (fVar93 * fVar42 + fVar106);
      fVar132 = fVar68 - (fVar100 * fVar48 + fVar43);
      fVar137 = fVar73 - (fVar100 * fVar30 + fVar43);
      fVar138 = fVar75 - (fVar100 * fVar41 + fVar43);
      fVar139 = fVar83 - (fVar100 * fVar42 + fVar43);
      fVar92 = fVar91 - (fVar103 * fVar48 + fVar53);
      fVar99 = fVar98 - (fVar103 * fVar30 + fVar53);
      fVar102 = fVar101 - (fVar103 * fVar41 + fVar53);
      fVar105 = fVar86 - (fVar103 * fVar42 + fVar53);
      fVar144 = (fVar77 * fVar48 + fVar62) - fVar57;
      fVar145 = (fVar77 * fVar30 + fVar62) - fVar59;
      fVar146 = (fVar77 * fVar41 + fVar62) - fVar67;
      fVar147 = (fVar77 * fVar42 + fVar62) - fVar70;
      fVar81 = (fVar61 * fVar48 + fVar69) - fVar68;
      fVar84 = (fVar61 * fVar30 + fVar69) - fVar73;
      fVar87 = (fVar61 * fVar41 + fVar69) - fVar75;
      fVar90 = (fVar61 * fVar42 + fVar69) - fVar83;
      fVar108 = (fVar80 * fVar48 + fVar89) - fVar91;
      fVar111 = (fVar80 * fVar30 + fVar89) - fVar98;
      fVar113 = (fVar80 * fVar41 + fVar89) - fVar101;
      fVar115 = (fVar80 * fVar42 + fVar89) - fVar86;
      fVar118 = fVar92 * fVar81 - fVar132 * fVar108;
      fVar121 = fVar99 * fVar84 - fVar137 * fVar111;
      fVar124 = fVar102 * fVar87 - fVar138 * fVar113;
      fVar127 = fVar105 * fVar90 - fVar139 * fVar115;
      fVar93 = fVar104 * fVar108 - fVar92 * fVar144;
      fVar100 = fVar74 * fVar111 - fVar99 * fVar145;
      fVar103 = fVar76 * fVar113 - fVar102 * fVar146;
      fVar106 = fVar78 * fVar115 - fVar105 * fVar147;
      fVar43 = fVar132 * fVar144 - fVar104 * fVar81;
      fVar53 = fVar137 * fVar145 - fVar74 * fVar84;
      fVar77 = fVar138 * fVar146 - fVar76 * fVar87;
      fVar61 = fVar139 * fVar147 - fVar78 * fVar90;
      fVar57 = fVar57 - *(float *)ray;
      fVar59 = fVar59 - *(float *)(ray + 4);
      fVar67 = fVar67 - *(float *)(ray + 8);
      fVar70 = fVar70 - *(float *)(ray + 0xc);
      fVar68 = fVar68 - *(float *)(ray + 0x10);
      fVar73 = fVar73 - *(float *)(ray + 0x14);
      fVar75 = fVar75 - *(float *)(ray + 0x18);
      fVar83 = fVar83 - *(float *)(ray + 0x1c);
      fVar91 = fVar91 - *(float *)(ray + 0x20);
      fVar98 = fVar98 - *(float *)(ray + 0x24);
      fVar101 = fVar101 - *(float *)(ray + 0x28);
      fVar86 = fVar86 - *(float *)(ray + 0x2c);
      local_19c8 = (float)*(undefined8 *)(ray + 0x60);
      fStack_19c4 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_19c0 = (float)*(undefined8 *)(ray + 0x68);
      fStack_19bc = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar128 = fVar68 * local_19c8 - fVar91 * fVar54;
      fVar129 = fVar73 * fStack_19c4 - fVar98 * fVar58;
      fVar130 = fVar75 * fStack_19c0 - fVar101 * fVar60;
      fVar131 = fVar83 * fStack_19bc - fVar86 * fVar109;
      fVar80 = *(float *)(ray + 0x40);
      fVar62 = *(float *)(ray + 0x44);
      fVar69 = *(float *)(ray + 0x48);
      fVar89 = *(float *)(ray + 0x4c);
      fVar48 = fVar91 * fVar80 - fVar57 * local_19c8;
      fVar30 = fVar98 * fVar62 - fVar59 * fStack_19c4;
      fVar41 = fVar101 * fVar69 - fVar67 * fStack_19c0;
      fVar42 = fVar86 * fVar89 - fVar70 * fStack_19bc;
      fVar140 = fVar57 * fVar54 - fVar68 * fVar80;
      fVar141 = fVar59 * fVar58 - fVar73 * fVar62;
      fVar142 = fVar67 * fVar60 - fVar75 * fVar69;
      fVar143 = fVar70 * fVar109 - fVar83 * fVar89;
      fVar54 = fVar80 * fVar118 + fVar54 * fVar93 + local_19c8 * fVar43;
      fVar58 = fVar62 * fVar121 + fVar58 * fVar100 + fStack_19c4 * fVar53;
      fVar60 = fVar69 * fVar124 + fVar60 * fVar103 + fStack_19c0 * fVar77;
      fVar89 = fVar89 * fVar127 + fVar109 * fVar106 + fStack_19bc * fVar61;
      uVar17 = (uint)fVar54 & 0x80000000;
      uVar120 = (uint)fVar58 & 0x80000000;
      uVar123 = (uint)fVar60 & 0x80000000;
      uVar126 = (uint)fVar89 & 0x80000000;
      fVar109 = (float)((uint)(fVar144 * fVar128 + fVar81 * fVar48 + fVar108 * fVar140) ^ uVar17);
      fVar81 = (float)((uint)(fVar145 * fVar129 + fVar84 * fVar30 + fVar111 * fVar141) ^ uVar120);
      fVar84 = (float)((uint)(fVar146 * fVar130 + fVar87 * fVar41 + fVar113 * fVar142) ^ uVar123);
      fVar87 = (float)((uint)(fVar147 * fVar131 + fVar90 * fVar42 + fVar115 * fVar143) ^ uVar126);
      auVar64._0_4_ = -(uint)(0.0 <= fVar109) & auVar135._0_4_;
      auVar64._4_4_ = -(uint)(0.0 <= fVar81) & auVar135._4_4_;
      auVar64._8_4_ = -(uint)(0.0 <= fVar84) & auVar135._8_4_;
      auVar64._12_4_ = -(uint)(0.0 <= fVar87) & auVar135._12_4_;
      iVar19 = movmskps(0xffffffff,auVar64);
      if (iVar19 == 0) {
LAB_006c1fb6:
        auVar56._8_8_ = uVar14;
        auVar56._0_8_ = uVar13;
        auVar52 = local_1a48;
        auVar66 = local_19f8;
        auVar72 = local_19d8;
        aVar97 = local_1a38;
        fVar93 = local_1a28;
        fVar100 = fStack_1a24;
        fVar103 = fStack_1a20;
        fVar106 = fStack_1a1c;
        fVar43 = local_1a18;
        fVar53 = fStack_1a14;
        fVar77 = fStack_1a10;
        fVar61 = fStack_1a0c;
        fVar80 = local_1a58;
        fVar62 = fStack_1a54;
        fVar69 = fStack_1a50;
        fVar70 = fStack_1a4c;
      }
      else {
        auVar72._0_4_ =
             (float)((uint)(fVar104 * fVar128 + fVar132 * fVar48 + fVar92 * fVar140) ^ uVar17);
        auVar72._4_4_ =
             (float)((uint)(fVar74 * fVar129 + fVar137 * fVar30 + fVar99 * fVar141) ^ uVar120);
        auVar72._8_4_ =
             (float)((uint)(fVar76 * fVar130 + fVar138 * fVar41 + fVar102 * fVar142) ^ uVar123);
        auVar72._12_4_ =
             (float)((uint)(fVar78 * fVar131 + fVar139 * fVar42 + fVar105 * fVar143) ^ uVar126);
        auVar96._0_4_ = -(uint)(0.0 <= auVar72._0_4_) & auVar64._0_4_;
        auVar96._4_4_ = -(uint)(0.0 <= auVar72._4_4_) & auVar64._4_4_;
        auVar96._8_4_ = -(uint)(0.0 <= auVar72._8_4_) & auVar64._8_4_;
        auVar96._12_4_ = -(uint)(0.0 <= auVar72._12_4_) & auVar64._12_4_;
        iVar19 = movmskps(iVar19,auVar96);
        if (iVar19 == 0) goto LAB_006c1fb6;
        fVar48 = ABS(fVar54);
        fVar30 = ABS(fVar58);
        fVar41 = ABS(fVar60);
        fVar42 = ABS(fVar89);
        auVar65._0_4_ = -(uint)(auVar72._0_4_ <= fVar48 - fVar109) & auVar96._0_4_;
        auVar65._4_4_ = -(uint)(auVar72._4_4_ <= fVar30 - fVar81) & auVar96._4_4_;
        auVar65._8_4_ = -(uint)(auVar72._8_4_ <= fVar41 - fVar84) & auVar96._8_4_;
        auVar65._12_4_ = -(uint)(auVar72._12_4_ <= fVar42 - fVar87) & auVar96._12_4_;
        iVar19 = movmskps(iVar19,auVar65);
        if (iVar19 == 0) goto LAB_006c1fb6;
        fVar80 = (float)(uVar17 ^ (uint)(fVar57 * fVar118 + fVar68 * fVar93 + fVar91 * fVar43));
        fVar62 = (float)(uVar120 ^ (uint)(fVar59 * fVar121 + fVar73 * fVar100 + fVar98 * fVar53));
        fVar69 = (float)(uVar123 ^ (uint)(fVar67 * fVar124 + fVar75 * fVar103 + fVar101 * fVar77));
        fVar70 = (float)(uVar126 ^ (uint)(fVar70 * fVar127 + fVar83 * fVar106 + fVar86 * fVar61));
        uVar17 = -(uint)(fVar80 <= *(float *)(ray + 0x80) * fVar48 &&
                        *(float *)(ray + 0x30) * fVar48 < fVar80) & auVar65._0_4_;
        uVar120 = -(uint)(fVar62 <= *(float *)(ray + 0x84) * fVar30 &&
                         *(float *)(ray + 0x34) * fVar30 < fVar62) & auVar65._4_4_;
        uVar123 = -(uint)(fVar69 <= *(float *)(ray + 0x88) * fVar41 &&
                         *(float *)(ray + 0x38) * fVar41 < fVar69) & auVar65._8_4_;
        uVar126 = -(uint)(fVar70 <= *(float *)(ray + 0x8c) * fVar42 &&
                         *(float *)(ray + 0x3c) * fVar42 < fVar70) & auVar65._12_4_;
        auVar12._4_4_ = uVar120;
        auVar12._0_4_ = uVar17;
        auVar12._8_4_ = uVar123;
        auVar12._12_4_ = uVar126;
        iVar19 = movmskps(iVar19,auVar12);
        if (iVar19 == 0) {
          auVar56._8_8_ = uVar14;
          auVar56._0_8_ = uVar13;
          fVar79 = INFINITY;
          fVar82 = INFINITY;
          fVar85 = INFINITY;
          fVar88 = INFINITY;
          auVar72 = local_19d8;
          fVar93 = local_1a28;
          fVar100 = fStack_1a24;
          fVar103 = fStack_1a20;
          fVar106 = fStack_1a1c;
          fVar43 = local_1a18;
          fVar53 = fStack_1a14;
          fVar77 = fStack_1a10;
          fVar61 = fStack_1a0c;
          fVar80 = local_1a58;
          fVar62 = fStack_1a54;
          fVar69 = fStack_1a50;
          fVar70 = fStack_1a4c;
        }
        else {
          aVar97.v[1] = fVar121;
          aVar97.v[0] = fVar118;
          aVar97.v[2] = fVar124;
          aVar97.v[3] = fVar127;
          auVar56._0_4_ = -(uint)(fVar54 != 0.0) & uVar17;
          auVar56._4_4_ = -(uint)(fVar58 != 0.0) & uVar120;
          auVar56._8_4_ = -(uint)(fVar60 != 0.0) & uVar123;
          auVar56._12_4_ = -(uint)(fVar89 != 0.0) & uVar126;
          iVar19 = movmskps(iVar19,auVar56);
          fVar79 = INFINITY;
          fVar82 = INFINITY;
          fVar85 = INFINITY;
          fVar88 = INFINITY;
          auVar66._4_4_ = fVar81;
          auVar66._0_4_ = fVar109;
          auVar66._8_4_ = fVar84;
          auVar66._12_4_ = fVar87;
          auVar52._4_4_ = fVar30;
          auVar52._0_4_ = fVar48;
          auVar52._8_4_ = fVar41;
          auVar52._12_4_ = fVar42;
          if (iVar19 == 0) goto LAB_006c1fb6;
        }
      }
      pRVar1 = (context->scene->geometries).items;
      pGVar2 = pRVar1[uVar117].ptr;
      uVar17 = pGVar2->mask;
      auVar133._0_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x90)) == 0);
      auVar133._4_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x94)) == 0);
      auVar133._8_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x98)) == 0);
      auVar133._12_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x9c)) == 0);
      auVar134 = ~auVar133 & auVar56;
      iVar19 = movmskps((int)pRVar1,auVar134);
      if (iVar19 == 0) {
        auVar136._4_4_ = auVar135._4_4_;
        auVar136._0_4_ = auVar135._0_4_;
        auVar136._8_4_ = auVar135._8_4_;
        auVar136._12_4_ = auVar135._12_4_;
        uVar18 = 0;
      }
      else {
        fVar83 = *(float *)(lVar24 + 0x10 + lVar29);
        valid_i = (vint<4> *)(ulong)(uint)fVar83;
        pRVar21 = context->args;
        if ((pRVar21->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar55 = rcpps((undefined1  [16])vVar15.field_0,auVar52);
          fVar79 = auVar55._0_4_;
          fVar82 = auVar55._4_4_;
          fVar85 = auVar55._8_4_;
          fVar88 = auVar55._12_4_;
          fVar79 = (1.0 - auVar52._0_4_ * fVar79) * fVar79 + fVar79;
          fVar82 = (1.0 - auVar52._4_4_ * fVar82) * fVar82 + fVar82;
          fVar85 = (1.0 - auVar52._8_4_ * fVar85) * fVar85 + fVar85;
          fVar88 = (1.0 - auVar52._12_4_ * fVar88) * fVar88 + fVar88;
          local_1778.v[0] = auVar66._0_4_ * fVar79;
          local_1778.v[1] = auVar66._4_4_ * fVar82;
          local_1778.v[2] = auVar66._8_4_ * fVar85;
          local_1778.v[3] = auVar66._12_4_ * fVar88;
          fStack_17b4 = fVar100;
          local_17c8._16_4_ = fVar93;
          fStack_17ac = fVar106;
          fStack_17b0 = fVar103;
          fStack_17a4 = fVar53;
          local_17a8 = fVar43;
          fStack_179c = fVar61;
          fStack_17a0 = fVar77;
          fStack_1794 = fVar62 * fVar82;
          local_1798 = fVar80 * fVar79;
          fStack_178c = fVar70 * fVar88;
          fStack_1790 = fVar69 * fVar85;
          fStack_1784 = fVar82 * auVar72._4_4_;
          local_1788 = fVar79 * auVar72._0_4_;
          fStack_177c = fVar88 * auVar72._12_4_;
          fStack_1780 = fVar85 * auVar72._8_4_;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          valid_i = (vint<4> *)&args;
          local_17c8._0_16_ = (undefined1  [16])aVar97;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)valid_i,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                      *)local_17c8);
          stack0xffffffffffffe848 = Ng.field_0._16_8_;
          _fStack_17b0 = Ng.field_0._24_8_;
          _local_17a8 = Ng.field_0._32_8_;
          _fStack_17a0 = Ng.field_0._40_8_;
          _local_1798 = u.field_0._0_8_;
          _fStack_1790 = u.field_0._8_8_;
          _local_1788 = v.field_0._0_8_;
          _fStack_1780 = v.field_0._8_8_;
          local_1758 = context->user->instID[0];
          local_1748 = context->user->instPrimID[0];
          auVar55 = *(undefined1 (*) [16])(ray + 0x80);
          auVar32 = blendvps(auVar55,(undefined1  [16])t.field_0,auVar134);
          *(undefined1 (*) [16])(ray + 0x80) = auVar32;
          args.valid = (int *)local_18f8;
          args.geometryUserPtr = pGVar2->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)local_17c8;
          args.N = 4;
          pRVar21 = (RTCIntersectArguments *)pGVar2->occlusionFilterN;
          args.ray = (RTCRayN *)ray;
          local_18f8 = auVar134;
          local_1778._0_4_ = fVar83;
          local_1778._4_4_ = fVar83;
          local_1778._8_4_ = fVar83;
          local_1778._12_4_ = fVar83;
          local_1768 = uVar117;
          uStack_1764 = uVar117;
          uStack_1760 = uVar117;
          uStack_175c = uVar117;
          uStack_1754 = local_1758;
          uStack_1750 = local_1758;
          uStack_174c = local_1758;
          uStack_1744 = local_1748;
          uStack_1740 = local_1748;
          uStack_173c = local_1748;
          if (pRVar21 != (RTCIntersectArguments *)0x0) {
            valid_i = (vint<4> *)&args;
            pRVar21 = (RTCIntersectArguments *)(*(code *)pRVar21)();
          }
          if (local_18f8 == (undefined1  [16])0x0) {
            auVar45._8_4_ = 0xffffffff;
            auVar45._0_8_ = 0xffffffffffffffff;
            auVar45._12_4_ = 0xffffffff;
            auVar45 = auVar45 ^ _DAT_01f46b70;
          }
          else {
            p_Var3 = context->args->filter;
            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
              valid_i = (vint<4> *)&args;
              (*p_Var3)((RTCFilterFunctionNArguments *)valid_i);
            }
            auVar39._0_4_ = -(uint)(local_18f8._0_4_ == 0);
            auVar39._4_4_ = -(uint)(local_18f8._4_4_ == 0);
            auVar39._8_4_ = -(uint)(local_18f8._8_4_ == 0);
            auVar39._12_4_ = -(uint)(local_18f8._12_4_ == 0);
            auVar45 = auVar39 ^ _DAT_01f46b70;
            auVar32 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar39);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar32;
            pRVar21 = (RTCIntersectArguments *)args.ray;
          }
          fVar88 = INFINITY;
          fVar85 = INFINITY;
          fVar82 = INFINITY;
          fVar79 = INFINITY;
          auVar46._0_4_ = auVar45._0_4_ << 0x1f;
          auVar46._4_4_ = auVar45._4_4_ << 0x1f;
          auVar46._8_4_ = auVar45._8_4_ << 0x1f;
          auVar46._12_4_ = auVar45._12_4_ << 0x1f;
          auVar134._0_4_ = auVar46._0_4_ >> 0x1f;
          auVar134._4_4_ = auVar46._4_4_ >> 0x1f;
          auVar134._8_4_ = auVar46._8_4_ >> 0x1f;
          auVar134._12_4_ = auVar46._12_4_ >> 0x1f;
          auVar55 = blendvps(auVar55,*(undefined1 (*) [16])(ray + 0x80),auVar46);
          *(undefined1 (*) [16])(ray + 0x80) = auVar55;
        }
        uVar18 = SUB84(pRVar21,0);
        auVar135._0_4_ = ~auVar134._0_4_ & auVar135._0_4_;
        auVar135._4_4_ = ~auVar134._4_4_ & auVar135._4_4_;
        auVar135._8_4_ = ~auVar134._8_4_ & auVar135._8_4_;
        auVar135._12_4_ = ~auVar134._12_4_ & auVar135._12_4_;
        auVar136 = auVar135;
      }
      uVar17 = movmskps(uVar18,auVar136);
      lVar29 = lVar29 + 4;
      fStack_1a24 = fVar100;
      local_1a28 = fVar93;
      fStack_1a20 = fVar103;
      fStack_1a1c = fVar106;
      _local_1a18 = CONCAT44(fVar53,fVar43);
      local_1a58 = fVar80;
      fStack_1a54 = fVar62;
      fStack_1a50 = fVar69;
      fStack_1a4c = fVar70;
      local_1a48 = auVar52;
      local_1a38 = aVar97;
      fStack_1a10 = fVar77;
      fStack_1a0c = fVar61;
      local_19f8 = auVar66;
      local_19d8 = auVar72;
    } while (uVar17 != 0);
    local_1968._0_4_ = local_1968._0_4_ & auVar135._0_4_;
    local_1968._4_4_ = local_1968._4_4_ & auVar135._4_4_;
    local_1968._8_4_ = local_1968._8_4_ & auVar135._8_4_;
    local_1968._12_4_ = local_1968._12_4_ & auVar135._12_4_;
    uVar17 = movmskps(uVar17,local_1968);
    sVar25 = sVar25 + 1;
    lVar24 = lVar24 + 0x140;
    fStack_1a24 = fVar100;
    local_1a28 = fVar93;
    fStack_1a20 = fVar103;
    fStack_1a1c = fVar106;
    _local_1a18 = CONCAT44(fVar53,fVar43);
    local_1a58 = fVar80;
    fStack_1a54 = fVar62;
    fStack_1a50 = fVar69;
    fStack_1a4c = fVar70;
    local_1a48 = auVar52;
    local_1a38 = aVar97;
    fStack_1a10 = fVar77;
    fStack_1a0c = fVar61;
    local_19f8 = auVar66;
    local_19d8 = auVar72;
  } while (uVar17 != 0);
  auVar47._0_8_ = local_1968._0_8_ ^ 0xffffffffffffffff;
  auVar47._8_4_ = local_1968._8_4_ ^ 0xffffffff;
  auVar47._12_4_ = local_1968._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)((undefined1  [16])vVar15.field_0 | auVar47);
  uVar17 = movmskps(uVar17,(undefined1  [16])terminated.field_0);
  if (uVar17 == 0xf) goto LAB_006c2889;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  fStack_1a24 = fVar100;
  local_1a28 = fVar93;
  fStack_1a20 = fVar103;
  fStack_1a1c = fVar106;
  _local_1a18 = CONCAT44(fVar53,fVar43);
  local_1a58 = fVar80;
  fStack_1a54 = fVar62;
  fStack_1a50 = fVar69;
  fStack_1a4c = fVar70;
  local_1a48 = auVar52;
  local_1a38 = aVar97;
  fStack_1a10 = fVar77;
  fStack_1a0c = fVar61;
  local_19f8 = auVar66;
  local_19d8 = auVar72;
  goto LAB_006c19e3;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }